

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O0

void __thiscall CVmMemoryStream::write_bytes(CVmMemoryStream *this,char *buf,size_t len)

{
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  
  if ((ulong)((*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10)) - *(long *)(in_RDI + 0x18)) <
      in_RDX) {
    err_throw(0);
  }
  memcpy(*(void **)(in_RDI + 0x18),in_RSI,in_RDX);
  *(ulong *)(in_RDI + 0x18) = in_RDX + *(long *)(in_RDI + 0x18);
  return;
}

Assistant:

void write_bytes(const char *buf, size_t len)
    {
        /* if we don't have space, throw an error */
        if (len > (size_t)((buf_ + buflen_) - p_))
            err_throw(VMERR_WRITE_FILE);

        /* copy the data */
        memcpy(p_, buf, len);

        /* advance past the data */
        p_ += len;
    }